

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_string_tpl.h
# Opt level: O2

void insert_string(deflate_state *s,uint32_t str,uint32_t count)

{
  int *piVar1;
  Pos PVar2;
  uchar *puVar3;
  Pos *pPVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  
  puVar3 = s->window;
  uVar5 = (ulong)str;
  lVar6 = count + uVar5;
  for (; piVar1 = (int *)(puVar3 + uVar5), piVar1 < puVar3 + lVar6; uVar5 = uVar5 + 1) {
    uVar7 = (uint)(*piVar1 * -0x61c8864f) >> 0x10;
    pPVar4 = s->head;
    PVar2 = pPVar4[uVar7];
    if ((Pos)uVar5 != PVar2) {
      s->prev[(uint)(ushort)s->w_mask & (uint)uVar5] = PVar2;
      pPVar4[uVar7] = (Pos)uVar5;
    }
  }
  return;
}

Assistant:

Z_INTERNAL void INSERT_STRING(deflate_state *const s, uint32_t str, uint32_t count) {
    uint8_t *strstart = s->window + str + HASH_CALC_OFFSET;
    uint8_t *strend = strstart + count;

    for (Pos idx = (Pos)str; strstart < strend; idx++, strstart++) {
        uint32_t val, hm;

        HASH_CALC_VAR_INIT;
        HASH_CALC_READ;
        HASH_CALC(HASH_CALC_VAR, val);
        HASH_CALC_VAR &= HASH_CALC_MASK;
        hm = HASH_CALC_VAR;

        Pos head = s->head[hm];
        if (LIKELY(head != idx)) {
            s->prev[idx & s->w_mask] = head;
            s->head[hm] = idx;
        }
    }
}